

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void PlayerLogCallback(void *userParam,PlayerBase *player,UINT8 level,UINT8 srcType,char *srcTag,
                      char *message)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *message_local;
  char *srcTag_local;
  UINT8 srcType_local;
  UINT8 level_local;
  PlayerBase *player_local;
  void *userParam_local;
  
  if (level <= logLevel) {
    if (srcType == '\0') {
      pcVar2 = LogLevel2Str(level);
      iVar1 = (*player->_vptr_PlayerBase[3])();
      printf("[%s] %s: %s",pcVar2,CONCAT44(extraout_var,iVar1),message);
    }
    else {
      pcVar2 = LogLevel2Str(level);
      iVar1 = (*player->_vptr_PlayerBase[3])();
      printf("[%s] %s %s: %s",pcVar2,CONCAT44(extraout_var_00,iVar1),srcTag,message);
    }
  }
  return;
}

Assistant:

static void PlayerLogCallback(void* userParam, PlayerBase* player, UINT8 level, UINT8 srcType,
	const char* srcTag, const char* message)
{
	if (level > logLevel)
		return;	// don't print messages with higher verbosity than current log level
	if (srcType == PLRLOGSRC_PLR)
		printf("[%s] %s: %s", LogLevel2Str(level), player->GetPlayerName(), message);
	else
		printf("[%s] %s %s: %s", LogLevel2Str(level), player->GetPlayerName(), srcTag, message);
	return;
}